

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  Index IVar1;
  JointActionObservationHistoryTree *pJVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000040;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000048;
  JointActionObservationHistory *in_stack_00000050;
  undefined1 auStack_78 [8];
  undefined1 *local_70;
  long local_68;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffa8;
  ulong uVar4;
  size_t t2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Index t;
  JointActionObservationHistoryTree *jaoht;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs_local;
  LIndex jaohI_local;
  PlanningUnitMADPDiscrete *this_local;
  
  joIs_local = jaIs;
  jaIs_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)jaohI;
  jaohI_local = (LIndex)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9d5c59);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9d5c62);
  pJVar2 = GetJointActionObservationHistoryTree(in_stack_ffffffffffffffa8,(LIndex)this);
  if (pJVar2 == (JointActionObservationHistoryTree *)0x0) {
    IVar1 = GetTimeStepForJAOHI((PlanningUnitMADPDiscrete *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                __vla_expr0);
    local_70 = auStack_78 + -((ulong)IVar1 * 4 + 0xf & 0xfffffffffffffff0);
    lVar3 = (long)(auStack_78 + -((ulong)IVar1 * 4 + 0xf & 0xfffffffffffffff0)) -
            ((ulong)IVar1 * 4 + 0xf & 0xfffffffffffffff0);
    local_68 = lVar3;
    *(undefined8 *)(lVar3 + -8) = 0x9d5cff;
    GetJointActionObservationHistoryArrays
              (*(PlanningUnitMADPDiscrete **)(lVar3 + 0x78),*(LIndex *)(lVar3 + 0x70),
               *(Index *)(lVar3 + 0x6c),*(Index **)(lVar3 + 0x60),*(Index **)(lVar3 + 0x58));
    for (uVar4 = 0; uVar4 < IVar1; uVar4 = uVar4 + 1) {
      *(undefined8 *)(lVar3 + -8) = 0x9d5d2b;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar3 + 0x18),
                 *(value_type_conflict1 **)(lVar3 + 0x10));
      *(undefined8 *)(lVar3 + -8) = 0x9d5d43;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar3 + 0x18),
                 *(value_type_conflict1 **)(lVar3 + 0x10));
    }
  }
  else {
    JointActionObservationHistoryTree::GetJointActionObservationHistory
              ((JointActionObservationHistoryTree *)this);
    JointActionObservationHistory::GetJointActionObservationHistoryVectors
              (in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryVectors
    (LIndex jaohI, vector<Index> &jaIs, vector<Index> &joIs) const
{
    jaIs.clear();
    joIs.clear();

    JointActionObservationHistoryTree* jaoht = 
        GetJointActionObservationHistoryTree(jaohI);
    // if it is not cached, jaoht will be set to 0
    if(jaoht)
    {
        jaoht->GetJointActionObservationHistory()->
            GetJointActionObservationHistoryVectors(jaIs, joIs);
    }
    else
    {    
        Index t = GetTimeStepForJAOHI(jaohI);
        Index jaIs_arr[t];
        Index joIs_arr[t];
        GetJointActionObservationHistoryArrays(jaohI, t, jaIs_arr, joIs_arr );
        for(size_t t2 = 0; t2 < t; t2++)
        {
            jaIs.push_back(jaIs_arr[t2]);
            joIs.push_back(joIs_arr[t2]);
        }
    }
}